

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QRegularExpression __thiscall QVariant::toRegularExpression(QVariant *this)

{
  qvariant_cast<QRegularExpression>(this);
  return (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
         (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)this;
}

Assistant:

QRegularExpression QVariant::toRegularExpression() const
{
    return qvariant_cast<QRegularExpression>(*this);
}